

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O0

void __thiscall
cali::RuntimeConfig::RuntimeConfigImpl::read_config_files
          (RuntimeConfigImpl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  undefined *__s;
  bool bVar1;
  char *pcVar2;
  long local_3f8;
  ifstream fs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  allocator<char> local_1b9;
  string local_1b8 [32];
  istringstream local_198 [8];
  istringstream is;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_local;
  RuntimeConfigImpl *this_local;
  
  __s = (anonymous_namespace)::builtin_profiles;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,__s,&local_1b9);
  std::__cxx11::istringstream::istringstream(local_198,local_1b8,_S_in);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  read_config_profiles(this,(istream *)local_198);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(filenames);
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(filenames);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&s), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&__end2);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_3f8,pcVar2,_S_in);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&local_3f8 + *(long *)(local_3f8 + -0x18)));
    if (bVar1) {
      read_config_profiles(this,(istream *)&local_3f8);
    }
    std::ifstream::~ifstream(&local_3f8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

void read_config_files(const std::vector<std::string>& filenames)
    {
        // read builtin profiles

        std::istringstream is(::builtin_profiles);
        read_config_profiles(is);

        for (const auto& s : filenames) {
            std::ifstream fs(s.c_str());

            if (fs)
                read_config_profiles(fs);
        }
    }